

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
           *this,GraphType *graph)

{
  bool bVar1;
  DigraphExtender<lemon::SmartDigraphBase> *in_RSI;
  ObserverBase *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  *in_stack_ffffffffffffff78;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  *in_stack_ffffffffffffff80;
  undefined1 local_58 [24];
  int local_40;
  Arc local_38;
  Arc local_34;
  Notifier *local_30;
  Arc local_14;
  DigraphExtender<lemon::SmartDigraphBase> *local_10;
  
  local_10 = in_RSI;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::ObserverBase::ObserverBase((ObserverBase *)0x2b7a96);
  in_RDI->_vptr_ObserverBase = (_func_int **)&PTR__ArrayMap_00313cc0;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x2b7ab7);
  SmartDigraphBase::Arc::Arc(&local_14);
  DigraphExtender<lemon::SmartDigraphBase>::notifier(local_10,local_14);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::ObserverBase::attach((ObserverBase *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  allocate_memory((ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
                   *)in_stack_ffffffffffffff80);
  local_30 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
             ::ObserverBase::notifier(in_RDI);
  SmartDigraphBase::Arc::Arc(&local_34);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::first(in_stack_ffffffffffffff80,(Item *)in_stack_ffffffffffffff78);
  while( true ) {
    SmartDigraphBase::Arc::Arc(&local_38);
    bVar1 = SmartDigraphBase::Arc::operator!=(&local_34,local_38);
    if (!bVar1) break;
    local_40 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
               ::id(in_stack_ffffffffffffff80,(Item *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
          *)&in_RDI[1]._index;
    in_stack_ffffffffffffff80 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
          *)(&(in_RDI[1]._notifier)->container + (long)local_40 * 3);
    memset(local_58,0,0x18);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x2b7bae);
    std::allocator_traits<std::allocator<std::vector<double,std::allocator<double>>>>::
    construct<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              ((allocator_type *)in_stack_ffffffffffffff80,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78,
               (vector<double,_std::allocator<double>_> *)0x2b7bc1);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
    ::next(in_stack_ffffffffffffff80,(Item *)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

explicit ArrayMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    allocate_memory();
    Notifier* nf = Parent::notifier();
    Item      it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }